

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

int quicly_stream_can_send(quicly_stream_t *stream,int at_stream_level)

{
  ulong uVar1;
  ulong uVar2;
  anon_struct_96_6_4bbd0dc7_for__send_aux *paVar3;
  
  if ((stream->sendstate).pending.num_ranges != 0) {
    paVar3 = &stream->_send_aux;
    if (at_stream_level == 0) {
      paVar3 = (anon_struct_96_6_4bbd0dc7_for__send_aux *)&(stream->sendstate).size_inflight;
    }
    uVar1 = ((stream->sendstate).pending.ranges)->start;
    if (uVar1 < paVar3->max_stream_data) {
      return 1;
    }
    uVar2 = (stream->sendstate).final_size;
    if (uVar2 <= uVar1) {
      if (uVar1 == uVar2) {
        return 1;
      }
      __assert_fail("stream->sendstate.pending.ranges[0].start == stream->sendstate.final_size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                    ,0xd53,"int quicly_stream_can_send(quicly_stream_t *, int)");
    }
    if ((at_stream_level != 0) && ((stream->_send_aux).blocked == QUICLY_SENDER_STATE_NONE)) {
      (stream->_send_aux).blocked = QUICLY_SENDER_STATE_SEND;
      sched_stream_control(stream);
    }
  }
  return 0;
}

Assistant:

int quicly_stream_can_send(quicly_stream_t *stream, int at_stream_level)
{
    /* return if there is nothing to be sent */
    if (stream->sendstate.pending.num_ranges == 0)
        return 0;

    /* return if flow is capped neither by MAX_STREAM_DATA nor (in case we are hitting connection-level flow control) by the number
     * of bytes we've already sent */
    uint64_t blocked_at = at_stream_level ? stream->_send_aux.max_stream_data : stream->sendstate.size_inflight;
    if (stream->sendstate.pending.ranges[0].start < blocked_at)
        return 1;
    /* we can always send EOS, if that is the only thing to be sent */
    if (stream->sendstate.pending.ranges[0].start >= stream->sendstate.final_size) {
        assert(stream->sendstate.pending.ranges[0].start == stream->sendstate.final_size);
        return 1;
    }

    /* if known to be blocked at stream-level, schedule the emission of STREAM_DATA_BLOCKED frame */
    if (at_stream_level && stream->_send_aux.blocked == QUICLY_SENDER_STATE_NONE) {
        stream->_send_aux.blocked = QUICLY_SENDER_STATE_SEND;
        sched_stream_control(stream);
    }

    return 0;
}